

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KLV.cpp
# Opt level: O1

bool __thiscall ASDCP::KLVPacket::HasUL(KLVPacket *this,byte_t *ul)

{
  byte_t *pbVar1;
  bool bVar2;
  UL *rhs;
  UL local_40;
  UL local_20;
  
  pbVar1 = this->m_KeyStart;
  if (pbVar1 == (byte_t *)0x0) {
    if ((this->m_UL).super_Identifier<16U>.m_HasValue != true) {
      return false;
    }
    rhs = &this->m_UL;
    local_40.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)ul;
    local_40.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(ul + 8);
  }
  else {
    local_40.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)ul;
    local_40.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(ul + 8);
    rhs = &local_20;
    local_20.super_Identifier<16U>.m_HasValue = true;
    local_20.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pbVar1;
    local_20.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pbVar1 + 8);
    local_20.super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)&PTR__IArchive_0021f038;
  }
  local_40.super_Identifier<16U>.m_HasValue = true;
  local_40.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021f038;
  bVar2 = UL::operator==(&local_40,rhs);
  return bVar2;
}

Assistant:

bool
ASDCP::KLVPacket::HasUL(const byte_t* ul)
{
  if ( m_KeyStart != 0 )
    {
      return UL(ul) == UL(m_KeyStart);
    }

  if ( m_UL.HasValue() )
    {
      return UL(ul) == m_UL;
    }

  return false;
}